

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O0

void __thiscall
icu_63::ContractionsAndExpansions::handleCE32
          (ContractionsAndExpansions *this,UChar32 start,UChar32 end,uint32_t ce32)

{
  CESink *pCVar1;
  uint32_t *puVar2;
  bool bVar3;
  UBool UVar4;
  int32_t iVar5;
  uint uVar6;
  int64_t iVar7;
  int64_t *piVar8;
  int32_t length_2;
  int local_1e0;
  UChar local_1da;
  UChar32 c;
  UChar hangul [1];
  UTF16CollationIterator iter;
  int local_30;
  int32_t length_1;
  int32_t i;
  int32_t length;
  uint32_t *ce32s;
  uint32_t ce32_local;
  UChar32 end_local;
  UChar32 start_local;
  ContractionsAndExpansions *this_local;
  
  ce32s._4_4_ = ce32;
  do {
    if ((ce32s._4_4_ & 0xff) < 0xc0) {
      if (this->sink == (CESink *)0x0) {
        return;
      }
      pCVar1 = this->sink;
      iVar7 = Collation::ceFromSimpleCE32(ce32s._4_4_);
      (*pCVar1->_vptr_CESink[2])(pCVar1,iVar7);
      return;
    }
    iVar5 = Collation::tagFromCE32(ce32s._4_4_);
    switch(iVar5) {
    case 0:
      return;
    case 1:
      if (this->sink == (CESink *)0x0) {
        return;
      }
      pCVar1 = this->sink;
      iVar7 = Collation::ceFromLongPrimaryCE32(ce32s._4_4_);
      (*pCVar1->_vptr_CESink[2])(pCVar1,iVar7);
      return;
    case 2:
      if (this->sink == (CESink *)0x0) {
        return;
      }
      pCVar1 = this->sink;
      iVar7 = Collation::ceFromLongSecondaryCE32(ce32s._4_4_);
      (*pCVar1->_vptr_CESink[2])(pCVar1,iVar7);
      return;
    case 3:
    case 7:
    case 0xd:
      UVar4 = ::U_SUCCESS(this->errorCode);
      if (UVar4 == '\0') {
        return;
      }
      this->errorCode = U_INTERNAL_PROGRAM_ERROR;
      return;
    case 4:
      if (this->sink != (CESink *)0x0) {
        iVar7 = Collation::latinCE0FromCE32(ce32s._4_4_);
        this->ces[0] = iVar7;
        iVar7 = Collation::latinCE1FromCE32(ce32s._4_4_);
        this->ces[1] = iVar7;
        (*this->sink->_vptr_CESink[3])(this->sink,this->ces,2);
      }
      UVar4 = UnicodeString::isEmpty(&this->unreversedPrefix);
      if (UVar4 == '\0') {
        return;
      }
      addExpansions(this,start,end);
      return;
    case 5:
      if (this->sink != (CESink *)0x0) {
        puVar2 = this->data->ce32s;
        iVar5 = Collation::indexFromCE32(ce32s._4_4_);
        uVar6 = Collation::lengthFromCE32(ce32s._4_4_);
        _i = puVar2 + iVar5;
        for (local_30 = 0; local_30 < (int)uVar6; local_30 = local_30 + 1) {
          iVar7 = Collation::ceFromCE32(*_i);
          this->ces[local_30] = iVar7;
          _i = _i + 1;
        }
        (*this->sink->_vptr_CESink[3])(this->sink,this->ces,(ulong)uVar6);
      }
      UVar4 = UnicodeString::isEmpty(&this->unreversedPrefix);
      if (UVar4 == '\0') {
        return;
      }
      addExpansions(this,start,end);
      return;
    case 6:
      if (this->sink != (CESink *)0x0) {
        uVar6 = Collation::lengthFromCE32(ce32s._4_4_);
        pCVar1 = this->sink;
        piVar8 = this->data->ces;
        iVar5 = Collation::indexFromCE32(ce32s._4_4_);
        (*pCVar1->_vptr_CESink[3])(pCVar1,piVar8 + iVar5,(ulong)uVar6);
      }
      UVar4 = UnicodeString::isEmpty(&this->unreversedPrefix);
      if (UVar4 == '\0') {
        return;
      }
      addExpansions(this,start,end);
      return;
    case 8:
      handlePrefixes(this,start,end,ce32s._4_4_);
      return;
    case 9:
      handleContractions(this,start,end,ce32s._4_4_);
      return;
    case 10:
      puVar2 = this->data->ce32s;
      iVar5 = Collation::indexFromCE32(ce32s._4_4_);
      ce32s._4_4_ = puVar2[iVar5];
      break;
    case 0xb:
      ce32s._4_4_ = *this->data->ce32s;
      break;
    case 0xc:
      if (this->sink == (CESink *)0x0) goto LAB_0029de2f;
      UTF16CollationIterator::UTF16CollationIterator
                ((UTF16CollationIterator *)&c,this->data,'\0',(UChar *)0x0,(UChar *)0x0,(UChar *)0x0
                );
      memset(&local_1da,0,2);
      local_1e0 = start;
      goto LAB_0029dcee;
    case 0xe:
      return;
    case 0xf:
      return;
    }
  } while( true );
LAB_0029dcee:
  if (end < local_1e0) {
    bVar3 = false;
LAB_0029de13:
    UTF16CollationIterator::~UTF16CollationIterator((UTF16CollationIterator *)&c);
    if (!bVar3) {
LAB_0029de2f:
      UVar4 = UnicodeString::isEmpty(&this->unreversedPrefix);
      if (UVar4 != '\0') {
        addExpansions(this,start,end);
      }
    }
    return;
  }
  local_1da = (UChar)local_1e0;
  UTF16CollationIterator::setText((UTF16CollationIterator *)&c,&local_1da,(UChar *)&c);
  iVar5 = CollationIterator::fetchCEs((CollationIterator *)&c,&this->errorCode);
  UVar4 = ::U_FAILURE(this->errorCode);
  if (UVar4 != '\0') {
    bVar3 = true;
    goto LAB_0029de13;
  }
  pCVar1 = this->sink;
  piVar8 = CollationIterator::getCEs((CollationIterator *)&c);
  (*pCVar1->_vptr_CESink[3])(pCVar1,piVar8,(ulong)(iVar5 - 1));
  local_1e0 = local_1e0 + 1;
  goto LAB_0029dcee;
}

Assistant:

void
ContractionsAndExpansions::handleCE32(UChar32 start, UChar32 end, uint32_t ce32) {
    for(;;) {
        if((ce32 & 0xff) < Collation::SPECIAL_CE32_LOW_BYTE) {
            // !isSpecialCE32()
            if(sink != NULL) {
                sink->handleCE(Collation::ceFromSimpleCE32(ce32));
            }
            return;
        }
        switch(Collation::tagFromCE32(ce32)) {
        case Collation::FALLBACK_TAG:
            return;
        case Collation::RESERVED_TAG_3:
        case Collation::BUILDER_DATA_TAG:
        case Collation::LEAD_SURROGATE_TAG:
            if(U_SUCCESS(errorCode)) { errorCode = U_INTERNAL_PROGRAM_ERROR; }
            return;
        case Collation::LONG_PRIMARY_TAG:
            if(sink != NULL) {
                sink->handleCE(Collation::ceFromLongPrimaryCE32(ce32));
            }
            return;
        case Collation::LONG_SECONDARY_TAG:
            if(sink != NULL) {
                sink->handleCE(Collation::ceFromLongSecondaryCE32(ce32));
            }
            return;
        case Collation::LATIN_EXPANSION_TAG:
            if(sink != NULL) {
                ces[0] = Collation::latinCE0FromCE32(ce32);
                ces[1] = Collation::latinCE1FromCE32(ce32);
                sink->handleExpansion(ces, 2);
            }
            // Optimization: If we have a prefix,
            // then the relevant strings have been added already.
            if(unreversedPrefix.isEmpty()) {
                addExpansions(start, end);
            }
            return;
        case Collation::EXPANSION32_TAG:
            if(sink != NULL) {
                const uint32_t *ce32s = data->ce32s + Collation::indexFromCE32(ce32);
                int32_t length = Collation::lengthFromCE32(ce32);
                for(int32_t i = 0; i < length; ++i) {
                    ces[i] = Collation::ceFromCE32(*ce32s++);
                }
                sink->handleExpansion(ces, length);
            }
            // Optimization: If we have a prefix,
            // then the relevant strings have been added already.
            if(unreversedPrefix.isEmpty()) {
                addExpansions(start, end);
            }
            return;
        case Collation::EXPANSION_TAG:
            if(sink != NULL) {
                int32_t length = Collation::lengthFromCE32(ce32);
                sink->handleExpansion(data->ces + Collation::indexFromCE32(ce32), length);
            }
            // Optimization: If we have a prefix,
            // then the relevant strings have been added already.
            if(unreversedPrefix.isEmpty()) {
                addExpansions(start, end);
            }
            return;
        case Collation::PREFIX_TAG:
            handlePrefixes(start, end, ce32);
            return;
        case Collation::CONTRACTION_TAG:
            handleContractions(start, end, ce32);
            return;
        case Collation::DIGIT_TAG:
            // Fetch the non-numeric-collation CE32 and continue.
            ce32 = data->ce32s[Collation::indexFromCE32(ce32)];
            break;
        case Collation::U0000_TAG:
            U_ASSERT(start == 0 && end == 0);
            // Fetch the normal ce32 for U+0000 and continue.
            ce32 = data->ce32s[0];
            break;
        case Collation::HANGUL_TAG:
            if(sink != NULL) {
                // TODO: This should be optimized,
                // especially if [start..end] is the complete Hangul range. (assert that)
                UTF16CollationIterator iter(data, FALSE, NULL, NULL, NULL);
                UChar hangul[1] = { 0 };
                for(UChar32 c = start; c <= end; ++c) {
                    hangul[0] = (UChar)c;
                    iter.setText(hangul, hangul + 1);
                    int32_t length = iter.fetchCEs(errorCode);
                    if(U_FAILURE(errorCode)) { return; }
                    // Ignore the terminating non-CE.
                    U_ASSERT(length >= 2 && iter.getCE(length - 1) == Collation::NO_CE);
                    sink->handleExpansion(iter.getCEs(), length - 1);
                }
            }
            // Optimization: If we have a prefix,
            // then the relevant strings have been added already.
            if(unreversedPrefix.isEmpty()) {
                addExpansions(start, end);
            }
            return;
        case Collation::OFFSET_TAG:
            // Currently no need to send offset CEs to the sink.
            return;
        case Collation::IMPLICIT_TAG:
            // Currently no need to send implicit CEs to the sink.
            return;
        }
    }
}